

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O0

string * __thiscall
ROM::Description::description_abi_cxx11_(string *__return_storage_ptr__,Description *this,int flags)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  _Setfill<char> _Var4;
  _Setw _Var5;
  ostream *poVar6;
  size_type sVar7;
  const_reference pvVar8;
  reference pbVar9;
  size_type sVar10;
  reference puVar11;
  undefined8 uVar12;
  char *pcVar13;
  iterator iStack_1f8;
  uint crc32;
  iterator __end2;
  iterator __begin2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2;
  bool is_first_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_name;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  bool is_first;
  stringstream local_1a8 [8];
  stringstream output;
  ostream local_198 [380];
  uint local_1c;
  Description *pDStack_18;
  int flags_local;
  Description *this_local;
  
  local_1c = flags;
  pDStack_18 = this;
  this_local = (Description *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                    (&this->crc32s);
  if (bVar2) {
    local_1c = local_1c & 0xfffffffd;
  }
  if ((local_1c & 4) == 0) {
    std::operator<<(local_198,(string *)&this->descriptive_name);
    if (local_1c == 0) {
      std::__cxx11::stringstream::str();
      goto LAB_0085b953;
    }
    std::operator<<(local_198," (");
  }
  else {
    local_1c = local_1c & 0xfffffffb;
    poVar6 = std::operator<<(local_198,(string *)&this->machine_name);
    std::operator<<(poVar6,'/');
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->file_names);
    if (sVar7 == 1) {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->file_names,0);
      std::operator<<(local_198,(string *)pvVar8);
    }
    else {
      std::operator<<(local_198,"{");
      bVar2 = true;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->file_names);
      file_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&this->file_names);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&file_name), bVar3) {
        pbVar9 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
        if (!bVar2) {
          std::operator<<(local_198," or ");
        }
        std::operator<<(local_198,(string *)pbVar9);
        bVar2 = false;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::operator<<(local_198,"}");
    }
    poVar6 = std::operator<<(local_198," (");
    std::operator<<(poVar6,(string *)&this->descriptive_name);
    if (local_1c == 0) {
      std::operator<<(local_198,")");
      std::__cxx11::stringstream::str();
      goto LAB_0085b953;
    }
    std::operator<<(local_198,"; ");
  }
  if ((local_1c & 1) != 0) {
    local_1c = local_1c & 0xfffffffe;
    poVar6 = (ostream *)std::ostream::operator<<(local_198,this->size);
    std::operator<<(poVar6," bytes");
    if (local_1c == 0) {
      std::operator<<(local_198,")");
      std::__cxx11::stringstream::str();
      goto LAB_0085b953;
    }
    std::operator<<(local_198,"; ");
  }
  if ((local_1c & 2) != 0) {
    local_1c = local_1c & 0xfffffffd;
    sVar10 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                       (&this->crc32s);
    pcVar13 = "usual crc32: ";
    if (1 < sVar10) {
      pcVar13 = "usual crc32s: ";
    }
    std::operator<<(local_198,pcVar13);
    bVar2 = true;
    __end2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       (&this->crc32s);
    iStack_1f8 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                           (&this->crc32s);
    while (bVar3 = std::operator!=(&__end2,&stack0xfffffffffffffe08), bVar3) {
      puVar11 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2);
      uVar1 = *puVar11;
      if (!bVar2) {
        std::operator<<(local_198,", ");
      }
      bVar2 = false;
      uVar12 = std::ostream::operator<<(local_198,std::hex);
      _Var4 = std::setfill<char>('0');
      poVar6 = std::operator<<(uVar12,_Var4._M_c);
      _Var5 = std::setw(8);
      poVar6 = std::operator<<(poVar6,_Var5);
      std::ostream::operator<<(poVar6,uVar1);
      std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2);
    }
    if (local_1c == 0) {
      std::operator<<(local_198,")");
      std::__cxx11::stringstream::str();
      goto LAB_0085b953;
    }
  }
  std::__cxx11::stringstream::str();
LAB_0085b953:
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Description::description(int flags) const {
	std::stringstream output;

	// If there are no CRCs, don't output them.
	if(crc32s.empty()) flags &= ~DescriptionFlag::CRC;

	// Print the file name(s) and the descriptive name.
	if(flags & DescriptionFlag::Filename) {
		flags &= ~DescriptionFlag::Filename;

		output << machine_name << '/';
		if(file_names.size() == 1) {
			output << file_names[0];
		} else {
			output << "{";
			bool is_first = true;
			for(const auto &file_name: file_names) {
				if(!is_first) output << " or ";
				output << file_name;
				is_first = false;
			}
			output << "}";
		}
		output << " (" << descriptive_name;
		if(!flags) {
			output << ")";
			return output.str();
		}
		output << "; ";
	} else {
		output << descriptive_name;
		if(!flags) {
			return output.str();
		}
		output << " (";
	}

	// Print the size.
	if(flags & DescriptionFlag::Size) {
		flags &= ~DescriptionFlag::Size;
		output << size << " bytes";

		if(!flags) {
			output << ")";
			return output.str();
		}
		output << "; ";
	}

	// Print the CRC(s).
	if(flags & DescriptionFlag::CRC) {
		flags &= ~DescriptionFlag::CRC;

		output << ((crc32s.size() > 1) ? "usual crc32s: " : "usual crc32: ");
		bool is_first = true;
		for(const auto crc32: crc32s) {
			if(!is_first) output << ", ";
			is_first = false;
			output << std::hex << std::setfill('0') << std::setw(8) << crc32;
		}

		if(!flags) {
			output << ")";
			return output.str();
		}
	}

	return output.str();
}